

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O3

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
setTrailParameters(AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this,
                  float duration,int vertexCount)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Vec3 *__s;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  this->trailDuration = duration;
  this->trailVertexCount = vertexCount;
  this->trailIndex = 0;
  this->trailLastSampleTime = 0.0;
  this->trailDottedPhase = 1;
  this->trailSampleInterval = duration / (float)vertexCount;
  if (this->trailVertices != (Vec3 *)0x0) {
    operator_delete__(this->trailVertices);
    vertexCount = this->trailVertexCount;
  }
  uVar6 = (ulong)vertexCount;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar2 = SUB168(auVar1 * ZEXT816(0xc),0);
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
    uVar5 = uVar2;
  }
  __s = (Vec3 *)operator_new__(uVar5);
  if (vertexCount != 0) {
    memset(__s,0,((uVar2 - 0xc) / 0xc) * 0xc + 0xc);
  }
  this->trailVertices = __s;
  if (this->trailFlags != (char *)0x0) {
    operator_delete__(this->trailFlags);
    vertexCount = this->trailVertexCount;
    uVar6 = (ulong)vertexCount;
  }
  pcVar3 = (char *)operator_new__(uVar6);
  this->trailFlags = pcVar3;
  if (0 < vertexCount) {
    lVar4 = 0;
    do {
      this->trailFlags[lVar4] = '\0';
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->trailVertexCount);
  }
  return;
}

Assistant:

void 
OpenSteer::AnnotationMixin<Super>::setTrailParameters (const float duration, 
                                                       const int vertexCount)
{
    // record new parameters
    trailDuration = duration;
    trailVertexCount = vertexCount;

    // reset other internal trail state
    trailIndex = 0;
    trailLastSampleTime = 0;
    trailSampleInterval = trailDuration / trailVertexCount;
    trailDottedPhase = 1;

    // prepare trailVertices array: free old one if needed, allocate new one
    delete[] trailVertices;
    trailVertices = new Vec3[trailVertexCount];

    // prepare trailFlags array: free old one if needed, allocate new one
    delete[] trailFlags;
    trailFlags = new char[trailVertexCount];

    // initializing all flags to zero means "do not draw this segment"
    for (int i = 0; i < trailVertexCount; i++) trailFlags[i] = 0;
}